

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O2

_Bool generate_starburst_room
                (chunk *c,wchar_t y1,wchar_t x1,wchar_t y2,wchar_t x2,_Bool light,wchar_t feat,
                _Bool special_ok)

{
  ulong uVar1;
  wchar_t wVar2;
  bool bVar3;
  _Bool _Var4;
  _Bool _Var5;
  int iVar6;
  uint32_t uVar7;
  int iVar8;
  int iVar9;
  loc lVar10;
  monster *pmVar11;
  object *poVar12;
  loc_conflict grid1;
  square *psVar13;
  loc grid;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  wchar_t wVar19;
  wchar_t wVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  long lVar26;
  uint uVar27;
  wchar_t wVar28;
  uint uVar29;
  wchar_t wVar30;
  uint32_t local_1a0 [2];
  wchar_t arc [45] [2];
  
  lVar10 = (loc)loc(x1,y1);
  _Var4 = square_in_bounds((chunk_conflict *)c,lVar10);
  if (_Var4) {
    lVar10 = (loc)loc(x2,y2);
    _Var4 = square_in_bounds((chunk_conflict *)c,lVar10);
    if ((_Var4) && (x1 + L'\x02' < x2 && y1 + L'\x02' < y2)) {
      iVar22 = y2 - y1;
      iVar25 = iVar22 + 1;
      iVar18 = x2 - x1;
      iVar21 = iVar18 + 1;
      if (((iVar21 * 5) / 2 < iVar25) || ((iVar25 * 5) / 2 < iVar21)) {
        if (iVar21 < iVar25) {
          wVar19 = (iVar25 * 2) / 3 + y1;
          wVar20 = x2;
        }
        else {
          wVar20 = (iVar21 * 2) / 3 + x1;
          wVar19 = y2;
        }
        generate_starburst_room(c,y1,x1,wVar19,wVar20,light,feat,false);
        if (iVar21 < iVar25) {
          wVar30 = iVar25 / 3 + y1;
          wVar28 = x1;
        }
        else {
          wVar28 = iVar21 / 3 + x1;
          wVar30 = y1;
        }
        generate_starburst_room(c,wVar30,wVar28,y2,x2,light,feat,false);
        _Var4 = feat_is_floor(feat);
        if (_Var4) {
          uVar14 = (long)(wVar19 + y1) / 2 & 0xffffffff;
          while (iVar18 = (int)uVar14, iVar18 <= (wVar30 + y2) / 2) {
            uVar14 = (long)(wVar20 + x1) / 2 & 0xffffffff;
            while (iVar21 = (int)uVar14, iVar21 <= (wVar28 + x2) / 2) {
              lVar10 = (loc)loc(iVar21,iVar18);
              square_set_feat((chunk_conflict *)c,lVar10,feat);
              uVar14 = (ulong)(iVar21 + 1);
            }
            uVar14 = (ulong)(iVar18 + 1);
          }
        }
        else {
          if (iVar21 < iVar25) {
            wVar19 = (iVar22 - iVar18) / 2 + y1;
          }
          else {
            iVar18 = (iVar18 - iVar22) / 2;
            x1 = x1 + iVar18;
            x2 = iVar18 + x1;
            wVar19 = y1;
            y1 = y2;
          }
          generate_starburst_room(c,wVar19,x1,y1,x2,light,feat,false);
        }
      }
      else {
        if (iVar25 < 0x2d && iVar21 < 0x2d) {
          iVar6 = 10;
        }
        else {
          iVar6 = iVar25;
          if (iVar25 < iVar21) {
            iVar6 = iVar21;
          }
          iVar6 = (iVar6 * 10) / 0x2c;
        }
        if ((special_ok && 10 < iVar25) && (uVar7 = Rand_div(0x14), uVar7 == 0)) {
          uVar16 = 0xc;
          bVar3 = true;
        }
        else {
          uVar7 = Rand_div(7);
          uVar16 = ((iVar21 * iVar25) / 0x50 - uVar7) + 0xb;
          uVar27 = 8;
          if (8 < (int)uVar16) {
            uVar27 = uVar16;
          }
          uVar16 = 0x2d;
          if ((int)uVar27 < 0x2d) {
            uVar16 = uVar27;
          }
          bVar3 = false;
        }
        local_1a0[1] = iVar25 / 4;
        local_1a0[0] = (iVar22 + 4) / 4;
        lVar15 = (ulong)(uVar16 - 1) << 3;
        uVar29 = 0xb4;
        uVar27 = uVar16 + 0xb4;
        uVar23 = 0;
        for (lVar26 = 0; (ulong)uVar16 * 8 != lVar26; lVar26 = lVar26 + 8) {
          *(uint *)((long)arc[0] + lVar26) = uVar23;
          uVar7 = Rand_div(uVar16);
          uVar24 = (int)(uVar7 + 0xb4) / (int)uVar16 + uVar23;
          if ((int)uVar24 <= (int)(uVar29 / uVar16)) {
            uVar24 = uVar29 / uVar16;
          }
          if (uVar27 / uVar16 <= uVar24) {
            uVar24 = uVar27 / uVar16;
          }
          if ((uVar24 + uVar23) - 0x2e < 0x59 || (uVar24 + uVar23) - 0xe2 < 0x59) {
            uVar7 = Rand_div(local_1a0[0]);
            iVar22 = uVar7 + local_1a0[1];
LAB_0014c119:
            *(int *)((long)arc[0] + lVar26 + 4) = iVar22;
          }
          else {
            if ((uVar23 + uVar24) - 0x88 < 0x59 || (uVar23 + uVar24) - 0x13c < 0xfffffef1) {
              uVar7 = Rand_div((iVar18 + 4) / 4);
              iVar22 = uVar7 + iVar21 / 4;
              goto LAB_0014c119;
            }
            if (lVar26 != 0) {
              iVar22 = 0;
              if (!bVar3) {
                iVar22 = *(int *)((long)arc[-1] + lVar26 + 4);
                uVar7 = Rand_div(7);
                iVar22 = (iVar22 - uVar7) + 3;
              }
              goto LAB_0014c119;
            }
          }
          if ((lVar26 != 0 && !bVar3) && (lVar15 != lVar26)) {
            _Var4 = feat_is_smooth(feat);
            iVar22 = *(int *)((long)arc[-1] + lVar26 + 4);
            iVar17 = *(int *)((long)arc[0] + lVar26 + 4);
            if (_Var4) {
              iVar8 = iVar22 + 2;
              if (iVar17 < iVar22 + 2) {
                iVar8 = iVar17;
              }
              iVar9 = iVar22 + -2;
              if (iVar8 < iVar22 + -2) {
                iVar9 = iVar8;
              }
            }
            else {
              iVar9 = (iVar22 * 3 + 3) / 2;
              if (iVar9 <= iVar17) {
                iVar17 = iVar9;
              }
              iVar9 = (iVar22 * 2 + -2) / 3;
              if (iVar9 < iVar17) {
                iVar9 = iVar17;
              }
            }
            *(int *)((long)arc[0] + lVar26 + 4) = iVar9;
          }
          if (lVar15 == lVar26) {
            wVar19 = *(wchar_t *)((long)arc[0] + lVar26 + 4);
            uVar7 = wVar19 - arc[0][1];
            uVar23 = -uVar7;
            if (0 < (int)uVar7) {
              uVar23 = uVar7;
            }
            if (3 < uVar23) {
              if (arc[0][1] < wVar19) {
                uVar7 = Rand_div(uVar7);
                uVar7 = -uVar7;
              }
              else {
                if (arc[0][1] <= wVar19) goto LAB_0014c1c7;
                uVar7 = Rand_div(arc[0][1] - wVar19);
              }
              *(wchar_t *)((long)arc[0] + lVar26 + 4) = wVar19 + uVar7;
            }
          }
LAB_0014c1c7:
          uVar27 = uVar27 + uVar16 + 0xb4;
          uVar29 = uVar29 + 0xb4;
          uVar23 = uVar24;
        }
        iVar18 = iVar25 / 2 + y1;
        iVar21 = iVar21 / 2 + x1;
        wVar19 = y1 + L'\x01';
        for (wVar20 = wVar19; wVar20 < y2; wVar20 = wVar20 + L'\x01') {
          wVar30 = x1;
LAB_0014c22a:
          wVar30 = wVar30 + L'\x01';
          if (wVar30 < x2) {
            lVar10 = (loc)loc(wVar30,wVar20);
            _Var4 = square_isvault((chunk_conflict *)c,lVar10);
            if (((!_Var4) &&
                (pmVar11 = square_monster((chunk_conflict *)c,lVar10), pmVar11 == (monster *)0x0))
               && (poVar12 = square_object((chunk_conflict *)c,lVar10), poVar12 == (object *)0x0)) {
              grid1 = loc(iVar21,iVar18);
              wVar28 = distance(grid1,(loc_conflict)lVar10);
              if (wVar28 < (iVar6 * 0x15) / 10) {
                iVar22 = ((wVar20 - iVar18) * 10) / iVar6;
                iVar25 = ((wVar30 - iVar21) * 10) / iVar6;
                if ((0xffffffd6 < iVar22 - 0x15U) && (0xffffffd6 < iVar25 - 0x15U)) {
                  uVar14 = (ulong)uVar16;
                  do {
                    if ((long)uVar14 < 1) goto LAB_0014c22a;
                    uVar1 = uVar14 - 1;
                    lVar15 = uVar14 * 2;
                    uVar14 = uVar1;
                  } while ((int)(uint)get_angle_to_grid[iVar22 + 0x14][iVar25 + 0x14] <
                           (int)local_1a0[lVar15]);
                  wVar2 = arc[uVar1][1];
                  if (wVar28 <= wVar2) {
                    _Var4 = feat_is_floor(feat);
                    if ((_Var4) || (_Var4 = feat_is_passable(feat), !_Var4)) {
                      square_set_feat((chunk_conflict *)c,lVar10,feat);
                      _Var4 = feat_is_floor(feat);
                      psVar13 = square((chunk_conflict *)c,lVar10);
                      if (_Var4) {
                        flag_on_dbg(psVar13->info,3,4,"square(c, grid)->info","SQUARE_ROOM");
                      }
                      else {
                        flag_off(psVar13->info,3,4);
                      }
                      if (!light) {
                        _Var4 = square_isbright((chunk_conflict *)c,lVar10);
                        if (!_Var4) {
                          psVar13 = square((chunk_conflict *)c,lVar10);
                          flag_off(psVar13->info,3,2);
                        }
                        goto LAB_0014c22a;
                      }
                    }
                    else {
                      _Var4 = feat_is_smooth(feat);
                      _Var5 = square_isfloor((chunk_conflict *)c,lVar10);
                      if (_Var4) {
                        if (_Var5) {
LAB_0014c3ff:
                          square_set_feat((chunk_conflict *)c,lVar10,feat);
                        }
                      }
                      else if ((_Var5) &&
                              (uVar7 = Rand_div(wVar2 + L'\x05'), wVar28 + L'\x04' <= (int)uVar7))
                      goto LAB_0014c3ff;
                      if (!light) goto LAB_0014c22a;
                    }
                    psVar13 = square((chunk_conflict *)c,lVar10);
                    flag_on_dbg(psVar13->info,3,2,"square(c, grid)->info","SQUARE_GLOW");
                  }
                }
              }
            }
            goto LAB_0014c22a;
          }
        }
        _Var4 = feat_is_floor(feat);
        if (feat != L'\x15' && !_Var4) {
          return true;
        }
        for (; wVar20 = x1, wVar19 < y2; wVar19 = wVar19 + L'\x01') {
          while (wVar20 = wVar20 + L'\x01', wVar20 < x2) {
            lVar10 = (loc)loc(wVar20,wVar19);
            _Var4 = square_isfloor((chunk_conflict *)c,lVar10);
            if (_Var4) {
              for (lVar15 = 0; lVar15 != 8; lVar15 = lVar15 + 1) {
                grid = (loc)loc_sum((loc_conflict)lVar10,(loc_conflict)ddgrid_ddd[lVar15]);
                psVar13 = square((chunk_conflict *)c,grid);
                flag_on_dbg(psVar13->info,3,4,"square(c, grid1)->info","SQUARE_ROOM");
                psVar13 = square((chunk_conflict *)c,grid);
                flag_on_dbg(psVar13->info,3,0x14,"square(c, grid1)->info","SQUARE_NO_STAIRS");
                if (light) {
                  psVar13 = square((chunk_conflict *)c,grid);
                  flag_on_dbg(psVar13->info,3,2,"square(c, grid1)->info","SQUARE_GLOW");
                }
                psVar13 = square((chunk_conflict *)c,grid);
                if (psVar13->feat == '\x15') {
                  set_marked_granite(c,(loc_conflict)grid,L'\f');
                }
              }
            }
          }
        }
      }
      return true;
    }
  }
  return false;
}

Assistant:

extern bool generate_starburst_room(struct chunk *c, int y1, int x1, int y2, 
									int x2, bool light, int feat, 
									bool special_ok)
{
	int y0, x0, y, x, ny, nx;
	int i, d;
	int dist, max_dist, dist_conv, dist_check;
	int height, width;
	int degree_first, center_of_arc, degree;

	/* Special variant room.  Discovered by accident. */
	bool make_cloverleaf = false;

	/* Holds first degree of arc, maximum effect distance in arc. */
	int arc[45][2];

	/* Number (max 45) of arcs. */
	int arc_num;

	/* Make certain the room does not cross the dungeon edge. */
	if ((!square_in_bounds(c, loc(x1, y1))) ||
		(!square_in_bounds(c, loc(x2, y2))))
		return (false);

	/* Robustness -- test sanity of input coordinates. */
	if ((y1 + 2 >= y2) || (x1 + 2 >= x2))
		return (false);


	/* Get room height and width. */
	height = 1 + y2 - y1;
	width = 1 + x2 - x1;


	/* Handle long, narrow rooms by dividing them up. */
	if ((height > 5 * width / 2) || (width > 5 * height / 2)) {
		int tmp_ay, tmp_ax, tmp_by, tmp_bx;

		/* Get bottom-left borders of the first room. */
		tmp_ay = y2;
		tmp_ax = x2;
		if (height > width)
			tmp_ay = y1 + 2 * height / 3;
		else
			tmp_ax = x1 + 2 * width / 3;

		/* Make the first room. */
		(void) generate_starburst_room(c, y1, x1, tmp_ay, tmp_ax, light, feat,
									   false);


		/* Get top_right borders of the second room. */
		tmp_by = y1;
		tmp_bx = x1;
		if (height > width)
			tmp_by = y1 + 1 * height / 3;
		else
			tmp_bx = x1 + 1 * width / 3;

		/* Make the second room. */
		(void) generate_starburst_room(c, tmp_by, tmp_bx, y2, x2, light, feat,
									   false);


		/* If floor, extend a "corridor" between room centers, to ensure 
		 * that the rooms are connected together. */
		if (feat_is_floor(feat)) {
			for (y = (y1 + tmp_ay) / 2; y <= (tmp_by + y2) / 2; y++) {
				for (x = (x1 + tmp_ax) / 2; x <= (tmp_bx + x2) / 2; x++) {
					square_set_feat(c, loc(x, y), feat);
				}
			}
		} else {
			/* Otherwise fill any gap between two starbursts. */
			int tmp_cy1, tmp_cx1, tmp_cy2, tmp_cx2;

			if (height > width) {
				tmp_cy1 = y1 + (height - width) / 2;
				tmp_cx1 = x1;
				tmp_cy2 = tmp_cy1 - (height - width) / 2;
				tmp_cx2 = x2;
			} else {
				tmp_cy1 = y1;
				tmp_cx1 = x1 + (width - height) / 2;
				tmp_cy2 = y2;
				tmp_cx2 = tmp_cx1 + (width - height) / 2;
			}

			/* Make the third room. */
			(void) generate_starburst_room(c, tmp_cy1, tmp_cx1, tmp_cy2,
										   tmp_cx2, light, feat, false);
		}

		/* Return. */
		return (true);
	}


	/* Get a shrinkage ratio for large rooms, as table is limited. */
	if ((width > 44) || (height > 44)) {
		if (width > height)
			dist_conv = 10 * width / 44;
		else
			dist_conv = 10 * height / 44;
	} else
		dist_conv = 10;


	/* Make a cloverleaf room sometimes. */
	if ((special_ok) && (height > 10) && (randint0(20) == 0)) {
		arc_num = 12;
		make_cloverleaf = true;
	}

	/* Usually, we make a normal starburst. */
	else {
		/* Ask for a reasonable number of arcs. */
		arc_num = 8 + (height * width / 80);
		arc_num = arc_num + 3 - randint0(7);
		if (arc_num < 8)
			arc_num = 8;
		if (arc_num > 45)
			arc_num = 45;
	}


	/* Get the center of the starburst. */
	y0 = y1 + height / 2;
	x0 = x1 + width / 2;

	/* Start out at zero degrees. */
	degree_first = 0;


	/* Determine the start degrees and expansion distance for each arc. */
	for (i = 0; i < arc_num; i++) {
		/* Get the first degree for this arc. */
		arc[i][0] = degree_first;

		/* Get a slightly randomized start degree for the next arc. */
		degree_first += (180 + randint0(arc_num)) / arc_num;
		if (degree_first < 180 * (i + 1) / arc_num)
			degree_first = 180 * (i + 1) / arc_num;
		if (degree_first > (180 + arc_num) * (i + 1) / arc_num)
			degree_first = (180 + arc_num) * (i + 1) / arc_num;


		/* Get the center of the arc. */
		center_of_arc = degree_first + arc[i][0];

		/* Calculate a reasonable distance to expand vertically. */
		if (((center_of_arc > 45) && (center_of_arc < 135))
			|| ((center_of_arc > 225) && (center_of_arc < 315))) {
			arc[i][1] = height / 4 + randint0((height + 3) / 4);
		}

		/* Calculate a reasonable distance to expand horizontally. */
		else if (((center_of_arc < 45) || (center_of_arc > 315))
				 || ((center_of_arc < 225) && (center_of_arc > 135))) {
			arc[i][1] = width / 4 + randint0((width + 3) / 4);
		}

		/* Handle arcs that count as neither vertical nor horizontal */
		else if (i != 0) {
			if (make_cloverleaf)
				arc[i][1] = 0;
			else
				arc[i][1] = arc[i - 1][1] + 3 - randint0(7);
		}


		/* Keep variability under control. */
		if ((!make_cloverleaf) && (i != 0) && (i != arc_num - 1)) {
			/* Water edges must be quite smooth. */
			if (feat_is_smooth(feat)) {
				if (arc[i][1] > arc[i - 1][1] + 2)
					arc[i][1] = arc[i - 1][1] + 2;

				if (arc[i][1] > arc[i - 1][1] - 2)
					arc[i][1] = arc[i - 1][1] - 2;
			} else {
				if (arc[i][1] > 3 * (arc[i - 1][1] + 1) / 2)
					arc[i][1] = 3 * (arc[i - 1][1] + 1) / 2;

				if (arc[i][1] < 2 * (arc[i - 1][1] - 1) / 3)
					arc[i][1] = 2 * (arc[i - 1][1] - 1) / 3;
			}
		}

		/* Neaten up final arc of circle by comparing it to the first. */
		if ((i == arc_num - 1) && (ABS(arc[i][1] - arc[0][1]) > 3)) {
			if (arc[i][1] > arc[0][1])
				arc[i][1] -= randint0(arc[i][1] - arc[0][1]);
			else if (arc[i][1] < arc[0][1])
				arc[i][1] += randint0(arc[0][1] - arc[i][1]);
		}
	}


	/* Precalculate check distance. */
	dist_check = 21 * dist_conv / 10;

	/* Change grids between (and not including) the edges. */
	for (y = y1 + 1; y < y2; y++) {
		for (x = x1 + 1; x < x2; x++) {
			struct loc grid = loc(x, y);

			/* Do not touch vault grids. */
			if (square_isvault(c, grid))
				continue;

			/* Do not touch occupied grids. */
			if (square_monster(c, grid))
				continue;
			if (square_object(c, grid))
				continue;

			/* Get distance to grid. */
			dist = distance(loc(x0, y0), grid);

			/* Reject grid if outside check distance. */
			if (dist >= dist_check) 
				continue;

			/* Convert and reorient grid for table access. */
			ny = 20 + 10 * (y - y0) / dist_conv;
			nx = 20 + 10 * (x - x0) / dist_conv;

			/* Illegal table access is bad. */
			if ((ny < 0) || (ny > 40) || (nx < 0) || (nx > 40))
				continue;

			/* Get angle to current grid. */
			degree = get_angle_to_grid[ny][nx];

			/* Scan arcs to find the one that applies here. */
			for (i = arc_num - 1; i >= 0; i--) {
				if (arc[i][0] <= degree) {
					max_dist = arc[i][1];

					/* Must be within effect range. */
					if (max_dist >= dist) {
						/* If new feature is not passable, or floor, always 
						 * place it. */
						if (feat_is_floor(feat) || !feat_is_passable(feat)) {
							square_set_feat(c, grid, feat);

							if (feat_is_floor(feat)) {
								sqinfo_on(square(c, grid)->info, SQUARE_ROOM);
							} else {
								sqinfo_off(square(c, grid)->info, SQUARE_ROOM);
							}

							if (light) {
								sqinfo_on(square(c, grid)->info, SQUARE_GLOW);
							} else if (!square_isbright(c, grid)) {
								sqinfo_off(square(c, grid)->info, SQUARE_GLOW);
							}
						}

						/* If new feature is non-floor passable terrain,
						 * place it only over floor. */
						else {
							/* Replace old feature entirely in some cases. */
							if (feat_is_smooth(feat)) {
								if (square_isfloor(c, grid))
									square_set_feat(c, grid, feat);
							} else {
								/* Make denser in the middle. */
								if (square_isfloor(c, grid) &&
									(randint1(max_dist + 5) >= dist + 5))
									square_set_feat(c, grid, feat);
							}

							/* Light grid. */
							if (light)
								sqinfo_on(square(c, grid)->info, SQUARE_GLOW);
						}
					}

					/* Arc found.  End search */
					break;
				}
			}
		}
	}

	/*
	 * If we placed floors or dungeon granite, all dungeon granite next
	 * to floors needs to become outer wall.
	 */
	if (feat_is_floor(feat) || feat == FEAT_GRANITE) {
		for (y = y1 + 1; y < y2; y++) {
			for (x = x1 + 1; x < x2; x++) {

				struct loc grid = loc(x, y);
				/* Floor grids only */
				if (square_isfloor(c, grid)) {
					/* Look in all directions. */
					for (d = 0; d < 8; d++) {
						/* Extract adjacent location */
						struct loc grid1 = loc_sum(grid, ddgrid_ddd[d]);

						/* Join to room, forbid stairs */
						sqinfo_on(square(c, grid1)->info, SQUARE_ROOM);
						sqinfo_on(square(c, grid1)->info, SQUARE_NO_STAIRS);

						/* Illuminate if requested. */
						if (light)
							sqinfo_on(square(c, grid1)->info, SQUARE_GLOW);

						/* Look for dungeon granite. */
						if (square(c, grid1)->feat == FEAT_GRANITE) {
							/* Mark as outer wall. */
							set_marked_granite(c, grid1, SQUARE_WALL_OUTER);
						}
					}
				}
			}
		}
	}

	/* Success */
	return (true);
}